

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::EntryPopJavascriptArray(ScriptContext *scriptContext,JavascriptArray *arr)

{
  Type TVar1;
  int iVar2;
  uint newLength;
  undefined1 local_50 [8];
  JsReentLock jsReentLock;
  Var element;
  
  local_50 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_50)->noJsReentrancy;
  ((ThreadContext *)local_50)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_50,arr);
  TVar1 = (arr->super_ArrayObject).length;
  if (TVar1 == 0) {
    jsReentLock._24_8_ =
         (((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase)
         .undefinedValue.ptr;
  }
  else {
    newLength = TVar1 - 1;
    *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    iVar2 = (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x71])(arr,(ulong)newLength,&jsReentLock.m_savedNoJsReentrancy);
    JsReentLock::MutateArrayObject((JsReentLock *)local_50);
    *(bool *)((long)local_50 + 0x108) = true;
    if (iVar2 == 0) {
      jsReentLock._24_8_ =
           (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    else {
      jsReentLock._24_8_ =
           CrossSite::MarshalVar
                     (scriptContext,(Var)jsReentLock._24_8_,
                      (((((arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.
                         ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                      ptr);
    }
    SetLength(arr,newLength);
    (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(arr);
  }
  *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return (Var)jsReentLock._24_8_;
}

Assistant:

Var JavascriptArray::EntryPopJavascriptArray(ScriptContext * scriptContext, JavascriptArray* arr)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, arr);

        uint32 length = arr->length;

        if (length == 0)
        {
            // If length is 0, return 'undefined'
            return scriptContext->GetLibrary()->GetUndefined();
        }

        uint32 index = length - 1;
        Var element;
        JS_REENTRANT(jsReentLock, BOOL gotItem = arr->DirectGetItemAtFull(index, &element));

        if (!gotItem)
        {
            element = scriptContext->GetLibrary()->GetUndefined();
        }
        else
        {
            element = CrossSite::MarshalVar(scriptContext, element, arr->GetScriptContext());
        }
        arr->SetLength(index); // SetLength will clear element at index

#ifdef VALIDATE_ARRAY
        arr->ValidateArray();
#endif
        return element;
    }